

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::NeuralNetworkRegressor::ByteSizeLong(NeuralNetworkRegressor *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Type *this_00;
  size_t sVar4;
  Type *this_01;
  size_t sVar5;
  ulong uVar6;
  uint uVar7;
  
  uVar3 = (this->layers_).super_RepeatedPtrFieldBase.current_size_;
  uVar6 = (ulong)uVar3;
  uVar7 = 0;
  if (uVar6 == 0) {
    uVar6 = 0;
  }
  else {
    do {
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                          (&(this->layers_).super_RepeatedPtrFieldBase,uVar7);
      sVar4 = NeuralNetworkLayer::ByteSizeLong(this_00);
      uVar2 = (uint)sVar4 | 1;
      iVar1 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar6 = uVar6 + sVar4 + (ulong)(iVar1 * 9 + 0x49U >> 6);
      uVar7 = uVar7 + 1;
    } while (uVar3 != uVar7);
  }
  uVar3 = (this->preprocessing_).super_RepeatedPtrFieldBase.current_size_;
  sVar4 = uVar6 + uVar3;
  if ((ulong)uVar3 != 0) {
    uVar7 = 0;
    do {
      this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing>::TypeHandler>
                          (&(this->preprocessing_).super_RepeatedPtrFieldBase,uVar7);
      sVar5 = NeuralNetworkPreprocessing::ByteSizeLong(this_01);
      uVar2 = (uint)sVar5 | 1;
      iVar1 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar4 = sVar4 + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6);
      uVar7 = uVar7 + 1;
    } while (uVar3 != uVar7);
  }
  if (this != (NeuralNetworkRegressor *)&_NeuralNetworkRegressor_default_instance_ &&
      this->updateparams_ != (NetworkUpdateParameters *)0x0) {
    sVar5 = NetworkUpdateParameters::ByteSizeLong(this->updateparams_);
    uVar3 = (uint)sVar5 | 1;
    iVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar4 = sVar4 + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
  }
  uVar3 = this->arrayinputshapemapping_;
  if (uVar3 != 0) {
    if ((int)uVar3 < 0) {
      uVar6 = 0xb;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar6 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
    sVar4 = sVar4 + uVar6;
  }
  uVar3 = this->imageinputshapemapping_;
  if (uVar3 != 0) {
    if ((int)uVar3 < 0) {
      uVar6 = 0xb;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar6 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
    sVar4 = sVar4 + uVar6;
  }
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

size_t NeuralNetworkRegressor::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.NeuralNetworkRegressor)
  size_t total_size = 0;

  // repeated .CoreML.Specification.NeuralNetworkLayer layers = 1;
  {
    unsigned int count = this->layers_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->layers(i));
    }
  }

  // repeated .CoreML.Specification.NeuralNetworkPreprocessing preprocessing = 2;
  {
    unsigned int count = this->preprocessing_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->preprocessing(i));
    }
  }

  // .CoreML.Specification.NetworkUpdateParameters updateParams = 10;
  if (this->has_updateparams()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->updateparams_);
  }

  // .CoreML.Specification.NeuralNetworkMultiArrayShapeMapping arrayInputShapeMapping = 5;
  if (this->arrayinputshapemapping() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->arrayinputshapemapping());
  }

  // .CoreML.Specification.NeuralNetworkImageShapeMapping imageInputShapeMapping = 6;
  if (this->imageinputshapemapping() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->imageinputshapemapping());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}